

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.cpp
# Opt level: O2

string * __thiscall
mjs::unicode::utf16_to_utf8_abi_cxx11_(string *__return_storage_ptr__,unicode *this,wstring_view in)

{
  conversion_result cVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  char buffer [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0;
  while( true ) {
    uVar4 = (uint)this - uVar3;
    if ((uint)this < uVar3 || uVar4 == 0) {
      return __return_storage_ptr__;
    }
    cVar1 = utf16_to_utf32<wchar_t>((wchar_t *)(in._M_len + (ulong)uVar3 * 4),uVar4);
    if (cVar1.length == 0) break;
    uVar4 = utf32_to_utf8<char>(cVar1.code_point,buffer);
    if (uVar4 == 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__exception_001c8d00;
      __cxa_throw(puVar2,&conversion_error::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::insert<char*,void>
              ((string *)__return_storage_ptr__,
               (const_iterator)
               ((__return_storage_ptr__->_M_dataplus)._M_p +
               __return_storage_ptr__->_M_string_length),buffer,buffer + uVar4);
    uVar3 = uVar3 + cVar1.length;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001c8d00;
  __cxa_throw(puVar2,&conversion_error::typeinfo,std::exception::~exception);
}

Assistant:

std::string utf16_to_utf8(const std::wstring_view in) {
    std::string res;
    const auto l = static_cast<unsigned>(in.length());
    char buffer[utf8_max_length];
    for (unsigned i = 0; i < l;) {
        const auto conv = utf16_to_utf32(&in[i], l - i);
        if (conv.length == invalid_length) {
            throw conversion_error{};
        }
        const auto out_len = utf32_to_utf8(conv.code_point, buffer);
        if (!out_len) {
            throw conversion_error{};
        }
        res.insert(res.end(), buffer, buffer + out_len);
        i += conv.length;
    }

    return res;
}